

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

gguf_context * gguf_init_from_file(char *fname,gguf_init_params params)

{
  FILE *__stream;
  undefined8 in_RDI;
  gguf_context *result;
  FILE *file;
  FILE *in_stack_000003e8;
  gguf_init_params in_stack_000003f0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  gguf_context *local_8;
  
  __stream = (FILE *)ggml_fopen(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"%s: failed to open GGUF file \'%s\'\n","gguf_init_from_file",in_RDI);
    local_8 = (gguf_context *)0x0;
  }
  else {
    local_8 = gguf_init_from_file_impl(in_stack_000003e8,in_stack_000003f0);
    fclose(__stream);
  }
  return local_8;
}

Assistant:

struct gguf_context * gguf_init_from_file(const char * fname, struct gguf_init_params params) {
    FILE * file = ggml_fopen(fname, "rb");

    if (!file) {
        fprintf(stderr, "%s: failed to open GGUF file '%s'\n", __func__, fname);
        return nullptr;
    }

    struct gguf_context * result = gguf_init_from_file_impl(file, params);
    fclose(file);
    return result;
}